

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::addSignalHandler(BlockData *this,int sigid,CFG *cfg)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppCVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int local_c;
  
  p_Var1 = &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < sigid]) {
    if (sigid <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, sigid < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  local_c = sigid;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    ppCVar2 = std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::
              operator[](&this->m_signalHandlers,&local_c);
    *ppCVar2 = cfg;
  }
  else if ((p_Var4[1]._M_parent)->_M_parent != (_Base_ptr)cfg->m_addr) {
    __assert_fail("it->second->addr() == cfg->addr()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0xa1,"void CfgNode::BlockData::addSignalHandler(int, CFG *)");
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* cfg) {
	std::map<int, CFG*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		assert(it->second->addr() == cfg->addr());
	} else {
		m_signalHandlers[sigid] = cfg;
	}
}